

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HuffmanTree.hpp
# Opt level: O2

void __thiscall kpeg::Node::~Node(Node *this)

{
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->parent).super___shared_ptr<kpeg::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->rChild).super___shared_ptr<kpeg::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->lChild).super___shared_ptr<kpeg::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string((string *)&this->code);
  return;
}

Assistant:

Node() :
         root{ false } ,
         leaf{ false } ,
         code{ "" } ,
         value{ 0x00 } ,
         lChild{ nullptr } ,
         rChild{ nullptr } ,
         parent{ nullptr }
        {}